

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O2

bool ptrie_insert(PTrie *ptrie,uintptr_t key,uintptr_t value)

{
  PTrieNode *pPVar1;
  ulong uVar2;
  size_t sVar3;
  void *pvVar4;
  PTrie *pPVar5;
  PTrie *pPVar6;
  uintptr_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  PTrieNode *pPVar10;
  bool bVar11;
  
  spinlock_acquire(&largeAllocSizes.lock);
  pPVar10 = largeAllocSizes.newAllocatedPage;
  if (largeAllocSizes.freeNodesList == (PTrieNode *)0x0) {
    if (largeAllocSizes.newAllocatedPage == (PTrieNode *)0x0) {
      largeAllocSizes.lock = 0;
      sVar3 = page_size();
      pvVar4 = mmap((void *)0x0,sVar3,3,0x22,-1,0);
      pPVar10 = (PTrieNode *)((long)pvVar4 + 1U & 0xfffffffffffffffe);
      if (pPVar10 == (PTrieNode *)0x0) {
        return false;
      }
      sVar3 = page_size();
      if (*(long *)((long)pPVar10->keys + (sVar3 - 8)) != 0) {
        __assert_fail("((char**)((char*)newNode + page_size()))[-1] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                      ,0x21b,"bool ptrie_insert(PTrie *, uintptr_t, uintptr_t)");
      }
      spinlock_acquire(&largeAllocSizes.lock);
      pPVar1 = largeAllocSizes.newAllocatedPage;
      sVar3 = page_size();
      *(PTrieNode **)((long)pPVar10->keys + (sVar3 - 8)) = pPVar1;
      largeAllocSizes.newAllocatedPage = pPVar10 + 1;
    }
    else {
      pPVar1 = largeAllocSizes.newAllocatedPage + 1;
      largeAllocSizes.newAllocatedPage = pPVar1;
      sVar3 = page_size();
      if ((sVar3 - 1 & (ulong)pPVar1) == 0) {
        largeAllocSizes.newAllocatedPage = largeAllocSizes.newAllocatedPage[-1].childNodes[1];
      }
    }
  }
  else {
    pPVar10 = largeAllocSizes.freeNodesList;
    largeAllocSizes.freeNodesList = (PTrieNode *)(largeAllocSizes.freeNodesList)->keys[0];
  }
  if (((ulong)ptrie & 0xff) != 0 || (key & 1) != 0) {
    __assert_fail("!((value & 1) | (key & 0xFF))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                  ,0x224,"bool ptrie_insert(PTrie *, uintptr_t, uintptr_t)");
  }
  pPVar5 = &largeAllocSizes;
  puVar7 = (uintptr_t *)0x0;
  do {
    pPVar1 = pPVar5->root;
    if (((ulong)pPVar1 & 1) != 0) {
      if (pPVar1 == (PTrieNode *)&DAT_00000001) {
        pPVar5->root = pPVar10;
        pPVar10->keys[0] = (uintptr_t)ptrie;
        pPVar10->childNodes[0] = (PTrieNode *)(key | 1);
        pPVar10->childNodes[1] = (PTrieNode *)&DAT_00000001;
      }
      else {
        pPVar6 = (PTrie *)(*puVar7 & 0xffffffffffffff00);
        if (pPVar6 == ptrie) {
          __assert_fail("x && \"key already inserted\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                        ,0x242,"bool ptrie_insert(PTrie *, uintptr_t, uintptr_t)");
        }
        uVar8 = (ulong)pPVar6 ^ (ulong)ptrie;
LAB_001346dd:
        uVar2 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        bVar11 = ((ulong)ptrie >> (uVar2 & 0x3f) & 1) != 0;
        uVar9 = (ulong)((uint)bVar11 * 8);
        *(PTrie **)((long)pPVar10->keys + uVar9) = ptrie;
        uVar8 = (ulong)((bVar11 ^ 1) << 3);
        *(PTrie **)((long)pPVar10->keys + uVar8) = pPVar6;
        pPVar10->keys[0] = pPVar10->keys[0] | uVar2;
        *(uintptr_t *)((long)pPVar10->childNodes + uVar9) = key | 1;
        *(PTrieNode **)((long)pPVar10->childNodes + uVar8) = pPVar1;
        pPVar5->root = pPVar10;
      }
      largeAllocSizes.lock = 0;
      return true;
    }
    uVar2 = pPVar1->keys[0];
    uVar8 = uVar2 ^ (ulong)ptrie;
    if ((uVar8 >> ((byte)uVar2 & 0x3f) & 0xfffffffffffffffe) != 0) {
      pPVar6 = (PTrie *)(uVar2 & 0xffffffffffffff00);
      goto LAB_001346dd;
    }
    bVar11 = ((ulong)ptrie >> (uVar2 & 0x3f) & 1) != 0;
    pPVar5 = (PTrie *)(pPVar1->childNodes + bVar11);
    puVar7 = pPVar1->keys + bVar11;
  } while( true );
}

Assistant:

static bool ptrie_insert(PTrie* ptrie, uintptr_t key, uintptr_t value)
{
	SPINLOCK_ACQUIRE(&ptrie->lock);
	// First get a new node.
	// The nodes are stored in memory pages allocated for that single purpose. Free nodes are arranged in a free list
	// (the first bytes in the node points to the next free page). The last bytes of the page are used to point to the
	// next free page, in case several pages where allocated at the same time by different threads.
	PTrieNode* newNode;
	if (ptrie->freeNodesList)
		ptrie->freeNodesList = *(PTrieNode**)(newNode = ptrie->freeNodesList);
	else if (ptrie->newAllocatedPage) {
		newNode = ptrie->newAllocatedPage;
		if (!((uintptr_t)++ptrie->newAllocatedPage & (LTALLOC_VMALLOC_MIN_SIZE() - 1)))
			ptrie->newAllocatedPage = ((PTrieNode**)ptrie->newAllocatedPage)[-1];
	}
	else {
		SPINLOCK_RELEASE(&ptrie->lock);
		newNode = (PTrieNode*)LTALLOC_VMALLOC(LTALLOC_VMALLOC_MIN_SIZE());
		if (unlikely(!newNode)) { return false; }
		LTALLOC_ASSERT(((char**)((char*)newNode + LTALLOC_VMALLOC_MIN_SIZE()))[-1] == 0);
		SPINLOCK_ACQUIRE(&ptrie->lock);
		((PTrieNode**)((char*)newNode + LTALLOC_VMALLOC_MIN_SIZE()))[-1] = ptrie->newAllocatedPage;//in case if other thread also have just allocated a new page
		ptrie->newAllocatedPage = newNode + 1;
	}
	// Then, insert it.
	PTrieNode** node = &ptrie->root, * n;
	uintptr_t* prevKey = NULL, x, pkey;
	unsigned int index, b;
	LTALLOC_ASSERT(!((value & 1) | (key & 0xFF)));//check constraints for key/value
	for (;;)
	{
		n = *node;
		if (!((uintptr_t)n & 1))//not a leaf
		{
			int prefixEnd = n->keys[0] & 0xFF;
			x = key ^ n->keys[0];// & ~0xFF;
			if (!(x & (~(uintptr_t)1 << prefixEnd))) {//prefix matches, so go on
				int branch = (key >> prefixEnd) & 1;
				node = &n->childNodes[branch];
				prevKey = &n->keys[branch];
			}
			else {//insert a new node before current
				pkey = n->keys[0] & ~0xFF;
				break;
			}
		}
		else {//leaf
			if (*node == PTRIE_NULL_NODE) {
				*node = newNode;
				newNode->keys[0] = key;//left prefixEnd = 0, so all following insertions will be before this node
				newNode->childNodes[0] = (PTrieNode*)(value | 1);
				newNode->childNodes[1] = PTRIE_NULL_NODE;
				SPINLOCK_RELEASE(&ptrie->lock);
				return true;
			}
			else {
				pkey = *prevKey & ~0xFF;
				x = key ^ pkey;
				LTALLOC_ASSERT(x/*key != pkey*/ && "key already inserted");
				break;
			}
		}
	}
	BSR(index, x);
	b = (key >> index) & 1;
	newNode->keys[b] = key;
	newNode->keys[b ^ 1] = pkey;
	newNode->keys[0] |= index;
	newNode->childNodes[b] = (PTrieNode*)(value | 1);
	newNode->childNodes[b ^ 1] = n;
	*node = newNode;
	SPINLOCK_RELEASE(&ptrie->lock);
	return true;
}